

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void AssignmentExpression_lshifteq_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_78 [8];
  JsValue r1;
  JsValue r2;
  JsValue v0;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_78);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_78,res_00);
  ShiftExpression_lshift_common(res_00,(JsAstNode *)na[1].location,context,res);
  JsPutValue((JsValue *)local_78,res,(JsValue *)((long)&r2.u + 8));
  return;
}

Assistant:

static void
AssignmentExpression_lshifteq_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstAssignmentExpressionNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstAssignmentExpressionNode *n = 
		CAST_NODE(na, JsAstAssignmentExpressionNode);
	struct JsValue r1, r2,v0;

	EVAL(n->lhs, context, &r1);
	JsGetValue( &r1, &r2);
	ShiftExpression_lshift_common(&r2, n->expr, context, res);
	JsPutValue( &r1, res,&v0);
}